

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GetInt32(char *zNum,int *pValue)

{
  bool bVar1;
  byte bVar2;
  uint local_38;
  int local_34;
  u32 u;
  int neg;
  int c;
  int i;
  sqlite_int64 v;
  int *pValue_local;
  char *zNum_local;
  
  _c = 0;
  local_34 = 0;
  if (*zNum == '-') {
    local_34 = 1;
    pValue_local = (int *)(zNum + 1);
  }
  else if (*zNum == '+') {
    pValue_local = (int *)(zNum + 1);
  }
  else {
    pValue_local = (int *)zNum;
    if ((*zNum == '0') && (((zNum[1] == 'x' || (zNum[1] == 'X')) && ((""[(byte)zNum[2]] & 8) != 0)))
       ) {
      local_38 = 0;
      for (pValue_local = (int *)(zNum + 2); (char)*pValue_local == '0';
          pValue_local = (int *)((long)pValue_local + 1)) {
      }
      for (neg = 0; (""[*(byte *)((long)pValue_local + (long)neg)] & 8) != 0 && neg < 8;
          neg = neg + 1) {
        bVar2 = sqlite3HexToInt((int)*(char *)((long)pValue_local + (long)neg));
        local_38 = local_38 * 0x10 + (uint)bVar2;
      }
      if (((local_38 & 0x80000000) == 0) &&
         ((""[*(byte *)((long)pValue_local + (long)neg)] & 8) == 0)) {
        *pValue = local_38;
        return 1;
      }
      return 0;
    }
  }
  if ((""[(byte)*pValue_local] & 4) == 0) {
    zNum_local._4_4_ = 0;
  }
  else {
    for (; (char)*pValue_local == '0'; pValue_local = (int *)((long)pValue_local + 1)) {
    }
    neg = 0;
    while( true ) {
      bVar1 = false;
      if (neg < 0xb) {
        u = (int)*(char *)((long)pValue_local + (long)neg) - 0x30;
        bVar1 = false;
        if (-1 < (int)u) {
          bVar1 = (int)u < 10;
        }
      }
      if (!bVar1) break;
      _c = _c * 10 + (long)(int)u;
      neg = neg + 1;
    }
    if (neg < 0xb) {
      if (_c - local_34 < 0x80000000) {
        if (local_34 != 0) {
          _c = -_c;
        }
        *pValue = (int)_c;
        zNum_local._4_4_ = 1;
      }
      else {
        zNum_local._4_4_ = 0;
      }
    }
    else {
      zNum_local._4_4_ = 0;
    }
  }
  return zNum_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetInt32(const char *zNum, int *pValue){
  sqlite_int64 v = 0;
  int i, c;
  int neg = 0;
  if( zNum[0]=='-' ){
    neg = 1;
    zNum++;
  }else if( zNum[0]=='+' ){
    zNum++;
  }
#ifndef SQLITE_OMIT_HEX_INTEGER
  else if( zNum[0]=='0'
        && (zNum[1]=='x' || zNum[1]=='X')
        && sqlite3Isxdigit(zNum[2])
  ){
    u32 u = 0;
    zNum += 2;
    while( zNum[0]=='0' ) zNum++;
    for(i=0; sqlite3Isxdigit(zNum[i]) && i<8; i++){
      u = u*16 + sqlite3HexToInt(zNum[i]);
    }
    if( (u&0x80000000)==0 && sqlite3Isxdigit(zNum[i])==0 ){
      memcpy(pValue, &u, 4);
      return 1;
    }else{
      return 0;
    }
  }
#endif
  if( !sqlite3Isdigit(zNum[0]) ) return 0;
  while( zNum[0]=='0' ) zNum++;
  for(i=0; i<11 && (c = zNum[i] - '0')>=0 && c<=9; i++){
    v = v*10 + c;
  }

  /* The longest decimal representation of a 32 bit integer is 10 digits:
  **
  **             1234567890
  **     2^31 -> 2147483648
  */
  testcase( i==10 );
  if( i>10 ){
    return 0;
  }
  testcase( v-neg==2147483647 );
  if( v-neg>2147483647 ){
    return 0;
  }
  if( neg ){
    v = -v;
  }
  *pValue = (int)v;
  return 1;
}